

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidDefaultOptionalValue(void)

{
  RepeatedField<long> *pRVar1;
  pointer pcVar2;
  ConvolutionLayerParams *pCVar3;
  bool bVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *this_00;
  Type *pTVar9;
  StackLayerParams *this_01;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  Result res;
  Model m;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_48.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_70 + 0x10;
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input1","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pAVar8->datatype_ = 0x10020;
  pRVar1 = &pAVar8->shape_;
  iVar14 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar13;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 3;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar13;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 5;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar14 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 2;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_48.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  pFVar7->isoptional_ = true;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pAVar8->datatype_ = 0x20020;
  if (pAVar8->_oneof_case_[1] != 0x33) {
    CoreML::Specification::ArrayFeatureType::clear_defaultOptionalValue(pAVar8);
    pAVar8->_oneof_case_[1] = 0x33;
  }
  (pAVar8->defaultOptionalValue_).intdefaultvalue_ = 0x40000000;
  pRVar1 = &pAVar8->shape_;
  iVar14 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar13;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 3;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar13;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 5;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar14 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 2;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_48.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar2) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar6->type_ == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  iVar14 = (pAVar8->shape_).total_size_;
  if ((pAVar8->shape_).current_size_ == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar13;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 3;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  iVar13 = iVar14 + 1;
  (pAVar8->shape_).current_size_ = iVar13;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 5;
  iVar14 = (pAVar8->shape_).total_size_;
  if (iVar13 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar14 + 1);
  }
  iVar14 = (pAVar8->shape_).current_size_;
  (pAVar8->shape_).current_size_ = iVar14 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar14] = 1;
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  (local_48.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input1");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->rank_ = 3;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                     (&(this_00->inputtensor_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pTVar9->rank_ = 3;
  if (this_00->_oneof_case_[0] != 0x39d) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x39d;
    this_01 = (StackLayerParams *)operator_new(0x20);
    CoreML::Specification::StackLayerParams::StackLayerParams(this_01);
    (this_00->layer_).stack_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  (pCVar3->kernelsize_).current_size_ = 2;
  (pCVar3->kernelsize_).total_size_ = 0;
  local_48.specificationversion_ = 4;
  CoreML::Model::validate((Result *)local_70,&local_48);
  bVar4 = CoreML::Result::good((Result *)local_70);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_((Result *)local_70);
    iVar14 = 0;
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x33908c,0);
    if (lVar12 != -1) goto LAB_00170d68;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               "res.message().find(\"mistmatch between dataType and the type\") != std::string::npos"
               ,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  iVar14 = 1;
  std::ostream::flush();
LAB_00170d68:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return iVar14;
}

Assistant:

int testInvalidDefaultOptionalValue() {

    Specification::Model m;

    auto *in1 = m.mutable_description()->add_input();
    in1->set_name("input1");
    auto *inShape1 = in1->mutable_type()->mutable_multiarraytype();
    inShape1->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_FLOAT32);

    inShape1->add_shape(3);
    inShape1->add_shape(5);
    inShape1->add_shape(2);

    auto *in2 = m.mutable_description()->add_input();
    in2->set_name("input2");
    auto type = in2->mutable_type();
    type->set_isoptional(true);
    auto arr = type->mutable_multiarraytype();
    arr->set_datatype(Specification::ArrayFeatureType::ArrayDataType::ArrayFeatureType_ArrayDataType_INT32);
    arr->set_floatdefaultvalue(2.0);
    arr->add_shape(3);
    arr->add_shape(5);
    arr->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(1);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input1");
    layers->add_input("input2");
    layers->add_output("output");
    layers->add_inputtensor()->set_rank(3);
    layers->add_inputtensor()->set_rank(3);

    auto *params = layers->mutable_stack();
    params->set_axis(2);

    m.set_specificationversion(4);
    // axis should be in range [-(rank + 1), rank + 1)
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("mistmatch between dataType and the type") != std::string::npos);

    return 0;
}